

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartPtr.hpp
# Opt level: O1

SmartPtr<Kernel::Ordering> * __thiscall
Lib::SmartPtr<Kernel::Ordering>::operator=
          (SmartPtr<Kernel::Ordering> *this,SmartPtr<Kernel::Ordering> *ptr)

{
  Ordering *pOVar1;
  RefCounter *pRVar2;
  Ordering *pOVar3;
  RefCounter *pRVar4;
  void **head;
  
  pOVar1 = this->_obj;
  pRVar2 = this->_refCnt;
  pOVar3 = ptr->_obj;
  this->_obj = pOVar3;
  pRVar4 = ptr->_refCnt;
  this->_refCnt = pRVar4;
  if (pRVar4 != (RefCounter *)0x0 && pOVar3 != (Ordering *)0x0) {
    pRVar4->_val = pRVar4->_val + 1;
  }
  if ((pRVar2 != (RefCounter *)0x0 && pOVar1 != (Ordering *)0x0) &&
     (pRVar2->_val = pRVar2->_val + -1, pRVar2->_val == 0)) {
    (*pOVar1->_vptr_Ordering[1])();
    *(undefined8 *)pRVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar2;
  }
  return this;
}

Assistant:

SmartPtr& operator=(const SmartPtr& ptr)
  {
    T* oldObj=_obj;
    RefCounter* oldCnt=_refCnt;
    _obj=ptr._obj;
    _refCnt=ptr._refCnt;

    if(_obj && _refCnt) {
      (_refCnt->_val)++;
    }

    if(oldObj && oldCnt) {
      (oldCnt->_val)--;
      ASS(oldCnt->_val >= 0);
      if(! oldCnt->_val) {
        checked_delete(oldObj);
        delete oldCnt;
      }
    }
    return *this;
  }